

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

int dic_add(dictionary *dic,void *key,int keyn)

{
  keynode **ppkVar1;
  uint32_t uVar2;
  int iVar3;
  keynode *pkVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  while( true ) {
    uVar2 = meiyan((char *)key,keyn);
    uVar5 = uVar2 % (uint)dic->length;
    pkVar4 = dic->table[(int)uVar5];
    if (pkVar4 != (keynode *)0x0) {
      while( true ) {
        if (pkVar4 == (keynode *)0x0) {
          dic->count = dic->count + 1;
          pkVar4 = keynode_new((char *)key,keyn);
          ppkVar1 = dic->table;
          pkVar4->next = ppkVar1[(int)uVar5];
          ppkVar1[(int)uVar5] = pkVar4;
          dic->value = &pkVar4->value;
          return 0;
        }
        if (((uint)pkVar4->len == keyn) &&
           (iVar3 = bcmp(pkVar4->key,key,(ulong)(uint)keyn), iVar3 == 0)) break;
        pkVar4 = pkVar4->next;
      }
      dic->value = &pkVar4->value;
      return 1;
    }
    dVar6 = (double)dic->length;
    dVar7 = (double)dic->count / dVar6;
    if (dVar7 < dic->growth_treshold || dVar7 == dic->growth_treshold) break;
    dic_resize(dic,(int)(dVar6 * dic->growth_factor));
  }
  pkVar4 = keynode_new((char *)key,keyn);
  dic->table[(int)uVar5] = pkVar4;
  dic->value = &dic->table[(int)uVar5]->value;
  dic->count = dic->count + 1;
  return 0;
}

Assistant:

int dic_add(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	if (dic->table[n] == 0) {
		double f = (double)dic->count / (double)dic->length;
		if (f > dic->growth_treshold) {
			dic_resize(dic, dic->length * dic->growth_factor);
			return dic_add(dic, key, keyn);
		}
		dic->table[n] = keynode_new((char*)key, keyn);
		dic->value = &dic->table[n]->value;
		dic->count++;
		return 0;
	}
	struct keynode *k = dic->table[n];
	while (k) {
		if (k->len == keyn && memcmp(k->key, key, keyn) == 0) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	dic->count++;
	struct keynode *k2 = keynode_new((char*)key, keyn);
	k2->next = dic->table[n];
	dic->table[n] = k2;
	dic->value = &k2->value;
	return 0;
}